

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# registry_entries.cpp
# Opt level: O1

void ot::commissioner::persistent_storage::from_json(json *aJson,BorderRouter *aValue)

{
  uint32_t *puVar1;
  byte *pbVar2;
  const_reference pvVar3;
  iterator iVar4;
  Timestamp TVar5;
  bool bVar6;
  bool bVar7;
  string value_2;
  uint ret;
  string timeStr;
  string_t local_a0;
  undefined1 local_80 [8];
  _Alloc_hider local_78;
  size_type local_70;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_68;
  undefined1 local_58 [8];
  _Alloc_hider local_50;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_48;
  
  pvVar3 = nlohmann::
           basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
           ::at(aJson,(key_type *)JSON_ID_abi_cxx11_);
  nlohmann::detail::
  from_json<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>,_unsigned_int,_0>
            (pvVar3,(uint *)local_80);
  (aValue->mId).mId = local_80._0_4_;
  (aValue->mAgent).mPresentFlags = 0;
  if (aJson->m_type == object) {
    iVar4 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>_>_>
            ::find(&((aJson->m_value).object)->_M_t,(key_type *)JSON_ADDR_abi_cxx11_);
    if ((_Rb_tree_header *)iVar4._M_node !=
        &(((aJson->m_value).object)->_M_t)._M_impl.super__Rb_tree_header) {
      pvVar3 = nlohmann::
               basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
               ::at(aJson,(key_type *)JSON_ADDR_abi_cxx11_);
      nlohmann::detail::
      from_json<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>>
                (pvVar3,&(aValue->mAgent).mAddr);
      puVar1 = &(aValue->mAgent).mPresentFlags;
      *(byte *)puVar1 = (byte)*puVar1 | 1;
    }
  }
  if (aJson->m_type == object) {
    iVar4 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>_>_>
            ::find(&((aJson->m_value).object)->_M_t,(key_type *)JSON_PORT_abi_cxx11_);
    if ((_Rb_tree_header *)iVar4._M_node !=
        &(((aJson->m_value).object)->_M_t)._M_impl.super__Rb_tree_header) {
      pvVar3 = nlohmann::
               basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
               ::at(aJson,(key_type *)JSON_PORT_abi_cxx11_);
      nlohmann::detail::
      from_json<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>,_unsigned_short,_0>
                (pvVar3,&(aValue->mAgent).mPort);
      puVar1 = &(aValue->mAgent).mPresentFlags;
      *(byte *)puVar1 = (byte)*puVar1 | 2;
    }
  }
  if (aJson->m_type == object) {
    iVar4 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>_>_>
            ::find(&((aJson->m_value).object)->_M_t,(key_type *)JSON_THREAD_VERSION_abi_cxx11_);
    if ((_Rb_tree_header *)iVar4._M_node !=
        &(((aJson->m_value).object)->_M_t)._M_impl.super__Rb_tree_header) {
      pvVar3 = nlohmann::
               basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
               ::at(aJson,(key_type *)JSON_THREAD_VERSION_abi_cxx11_);
      nlohmann::detail::
      from_json<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>>
                (pvVar3,&(aValue->mAgent).mThreadVersion);
      puVar1 = &(aValue->mAgent).mPresentFlags;
      *(byte *)puVar1 = (byte)*puVar1 | 4;
    }
  }
  if (aJson->m_type == object) {
    iVar4 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>_>_>
            ::find(&((aJson->m_value).object)->_M_t,(key_type *)JSON_STATE_BITMAP_abi_cxx11_);
    if ((_Rb_tree_header *)iVar4._M_node !=
        &(((aJson->m_value).object)->_M_t)._M_impl.super__Rb_tree_header) {
      pvVar3 = nlohmann::
               basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
               ::at(aJson,(key_type *)JSON_STATE_BITMAP_abi_cxx11_);
      nlohmann::detail::
      from_json<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>,_unsigned_int,_0>
                (pvVar3,(uint *)local_80);
      BorderAgent::State::State((State *)local_58,local_80._0_4_);
      *(undefined2 *)&(aValue->mAgent).mState = local_58._0_2_;
      puVar1 = &(aValue->mAgent).mPresentFlags;
      *(byte *)puVar1 = (byte)*puVar1 | 8;
    }
  }
  if (aJson->m_type == object) {
    iVar4 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>_>_>
            ::find(&((aJson->m_value).object)->_M_t,(key_type *)JSON_NWK_REF_abi_cxx11_);
    if ((_Rb_tree_header *)iVar4._M_node !=
        &(((aJson->m_value).object)->_M_t)._M_impl.super__Rb_tree_header) {
      pvVar3 = nlohmann::
               basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
               ::at(aJson,(key_type *)JSON_NWK_REF_abi_cxx11_);
      nlohmann::detail::
      from_json<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>,_unsigned_int,_0>
                (pvVar3,(uint *)local_80);
      (aValue->mNetworkId).mId = local_80._0_4_;
    }
  }
  if (aJson->m_type == object) {
    iVar4 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>_>_>
            ::find(&((aJson->m_value).object)->_M_t,(key_type *)JSON_VENDOR_NAME_abi_cxx11_);
    if ((_Rb_tree_header *)iVar4._M_node !=
        &(((aJson->m_value).object)->_M_t)._M_impl.super__Rb_tree_header) {
      pvVar3 = nlohmann::
               basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
               ::at(aJson,(key_type *)JSON_VENDOR_NAME_abi_cxx11_);
      nlohmann::detail::
      from_json<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>>
                (pvVar3,&(aValue->mAgent).mVendorName);
      puVar1 = &(aValue->mAgent).mPresentFlags;
      *(byte *)puVar1 = (byte)*puVar1 | 0x40;
    }
  }
  if (aJson->m_type == object) {
    iVar4 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>_>_>
            ::find(&((aJson->m_value).object)->_M_t,(key_type *)JSON_MODEL_NAME_abi_cxx11_);
    if ((_Rb_tree_header *)iVar4._M_node !=
        &(((aJson->m_value).object)->_M_t)._M_impl.super__Rb_tree_header) {
      pvVar3 = nlohmann::
               basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
               ::at(aJson,(key_type *)JSON_MODEL_NAME_abi_cxx11_);
      nlohmann::detail::
      from_json<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>>
                (pvVar3,&(aValue->mAgent).mModelName);
      puVar1 = &(aValue->mAgent).mPresentFlags;
      *(byte *)puVar1 = (byte)*puVar1 | 0x80;
    }
  }
  if (aJson->m_type == object) {
    iVar4 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>_>_>
            ::find(&((aJson->m_value).object)->_M_t,(key_type *)&JSON_ACTIVE_TIMESTAMP_abi_cxx11_);
    if ((_Rb_tree_header *)iVar4._M_node !=
        &(((aJson->m_value).object)->_M_t)._M_impl.super__Rb_tree_header) {
      pvVar3 = nlohmann::
               basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
               ::at(aJson,(key_type *)&JSON_ACTIVE_TIMESTAMP_abi_cxx11_);
      nlohmann::detail::
      get_arithmetic_value<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>,_unsigned_long,_0>
                (pvVar3,(unsigned_long *)local_80);
      TVar5 = Timestamp::Decode(CONCAT44(local_80._4_4_,local_80._0_4_));
      (aValue->mAgent).mActiveTimestamp = TVar5;
      pbVar2 = (byte *)((long)&(aValue->mAgent).mPresentFlags + 1);
      *pbVar2 = *pbVar2 | 1;
    }
  }
  if (aJson->m_type == object) {
    iVar4 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>_>_>
            ::find(&((aJson->m_value).object)->_M_t,(key_type *)JSON_PARTITION_ID_abi_cxx11_);
    if ((_Rb_tree_header *)iVar4._M_node !=
        &(((aJson->m_value).object)->_M_t)._M_impl.super__Rb_tree_header) {
      pvVar3 = nlohmann::
               basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
               ::at(aJson,(key_type *)JSON_PARTITION_ID_abi_cxx11_);
      nlohmann::detail::
      from_json<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>,_unsigned_int,_0>
                (pvVar3,&(aValue->mAgent).mPartitionId);
      pbVar2 = (byte *)((long)&(aValue->mAgent).mPresentFlags + 1);
      *pbVar2 = *pbVar2 | 2;
    }
  }
  if (aJson->m_type == object) {
    iVar4 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>_>_>
            ::find(&((aJson->m_value).object)->_M_t,(key_type *)JSON_VENDOR_DATA_abi_cxx11_);
    if ((_Rb_tree_header *)iVar4._M_node !=
        &(((aJson->m_value).object)->_M_t)._M_impl.super__Rb_tree_header) {
      pvVar3 = nlohmann::
               basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
               ::at(aJson,(key_type *)JSON_VENDOR_DATA_abi_cxx11_);
      nlohmann::detail::
      from_json<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>>
                (pvVar3,&(aValue->mAgent).mVendorData);
      pbVar2 = (byte *)((long)&(aValue->mAgent).mPresentFlags + 1);
      *pbVar2 = *pbVar2 | 4;
    }
  }
  if (aJson->m_type == object) {
    iVar4 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>_>_>
            ::find(&((aJson->m_value).object)->_M_t,(key_type *)JSON_VENDOR_OUI_abi_cxx11_);
    if ((_Rb_tree_header *)iVar4._M_node !=
        &(((aJson->m_value).object)->_M_t)._M_impl.super__Rb_tree_header) {
      local_80._0_4_ = kNone;
      local_70 = 0;
      local_68._M_local_buf[0] = '\0';
      local_a0._M_string_length = 0;
      local_a0.field_2._M_local_buf[0] = '\0';
      local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
      local_78._M_p = (pointer)&local_68;
      pvVar3 = nlohmann::
               basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
               ::at(aJson,(key_type *)JSON_VENDOR_OUI_abi_cxx11_);
      nlohmann::detail::
      from_json<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>>
                (pvVar3,&local_a0);
      utils::Hex((Error *)local_58,&(aValue->mAgent).mVendorOui,&local_a0);
      local_80._0_4_ = local_58._0_4_;
      std::__cxx11::string::operator=((string *)&local_78,(string *)&local_50);
      if (local_50._M_p != local_48._M_local_buf + 8) {
        operator_delete(local_50._M_p);
      }
      if ((State)local_80._0_4_ != (State)0x0) {
        __assert_fail("condition",
                      "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/ps/registry_entries.cpp"
                      ,0x139,
                      "void ot::commissioner::persistent_storage::from_json(const json &, BorderRouter &)"
                     );
      }
      pbVar2 = (byte *)((long)&(aValue->mAgent).mPresentFlags + 1);
      *pbVar2 = *pbVar2 | 8;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
        operator_delete(local_a0._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_78._M_p != &local_68) {
        operator_delete(local_78._M_p);
      }
    }
  }
  if (aJson->m_type == object) {
    iVar4 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>_>_>
            ::find(&((aJson->m_value).object)->_M_t,(key_type *)JSON_BBR_SEQ_NUMBER_abi_cxx11_);
    if ((_Rb_tree_header *)iVar4._M_node !=
        &(((aJson->m_value).object)->_M_t)._M_impl.super__Rb_tree_header) {
      pvVar3 = nlohmann::
               basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
               ::at(aJson,(key_type *)JSON_BBR_SEQ_NUMBER_abi_cxx11_);
      nlohmann::detail::
      from_json<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>,_unsigned_char,_0>
                (pvVar3,&(aValue->mAgent).mBbrSeqNumber);
      pbVar2 = (byte *)((long)&(aValue->mAgent).mPresentFlags + 1);
      *pbVar2 = *pbVar2 | 0x20;
    }
  }
  if (aJson->m_type == object) {
    iVar4 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>_>_>
            ::find(&((aJson->m_value).object)->_M_t,(key_type *)JSON_BBR_PORT_abi_cxx11_);
    if ((_Rb_tree_header *)iVar4._M_node !=
        &(((aJson->m_value).object)->_M_t)._M_impl.super__Rb_tree_header) {
      pvVar3 = nlohmann::
               basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
               ::at(aJson,(key_type *)JSON_BBR_PORT_abi_cxx11_);
      nlohmann::detail::
      from_json<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>,_unsigned_short,_0>
                (pvVar3,&(aValue->mAgent).mBbrPort);
      pbVar2 = (byte *)((long)&(aValue->mAgent).mPresentFlags + 1);
      *pbVar2 = *pbVar2 | 0x40;
    }
  }
  if (aJson->m_type == object) {
    iVar4 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>_>_>
            ::find(&((aJson->m_value).object)->_M_t,(key_type *)JSON_SERVICE_NAME_abi_cxx11_);
    if ((_Rb_tree_header *)iVar4._M_node !=
        &(((aJson->m_value).object)->_M_t)._M_impl.super__Rb_tree_header) {
      pvVar3 = nlohmann::
               basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
               ::at(aJson,(key_type *)JSON_SERVICE_NAME_abi_cxx11_);
      nlohmann::detail::
      from_json<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>>
                (pvVar3,&(aValue->mAgent).mServiceName);
      pbVar2 = (byte *)((long)&(aValue->mAgent).mPresentFlags + 2);
      *pbVar2 = *pbVar2 | 1;
    }
  }
  if (aJson->m_type == object) {
    iVar4 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>_>_>
            ::find(&((aJson->m_value).object)->_M_t,(key_type *)&JSON_UPDATE_TIMESTAMP_abi_cxx11_);
    if ((_Rb_tree_header *)iVar4._M_node !=
        &(((aJson->m_value).object)->_M_t)._M_impl.super__Rb_tree_header) {
      local_50._M_p = (pointer)0x0;
      local_48._M_local_buf[0] = '\0';
      local_58 = (undefined1  [8])&local_48;
      pvVar3 = nlohmann::
               basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
               ::at(aJson,(key_type *)&JSON_UPDATE_TIMESTAMP_abi_cxx11_);
      nlohmann::detail::
      from_json<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>>
                (pvVar3,(string_t *)local_58);
      UnixTime::UnixTime((UnixTime *)&local_a0,0);
      UnixTime::FromString((Error *)local_80,(UnixTime *)&local_a0,(string *)local_58);
      bVar6 = (State)local_80._0_4_ == (State)0x0;
      bVar7 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_a0._M_dataplus._M_p !=
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)0x0;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_78._M_p != &local_68) {
        operator_delete(local_78._M_p);
      }
      if (bVar7 && bVar6) {
        (aValue->mAgent).mUpdateTimestamp.mTime = (time_t)local_a0._M_dataplus._M_p;
        pbVar2 = (byte *)((long)&(aValue->mAgent).mPresentFlags + 2);
        *pbVar2 = *pbVar2 | 2;
      }
      if (local_58 != (undefined1  [8])&local_48) {
        operator_delete((void *)local_58);
      }
    }
  }
  return;
}

Assistant:

void from_json(const json &aJson, BorderRouter &aValue)
{
    aJson.at(JSON_ID).get_to(aValue.mId);
    aValue.mAgent.mPresentFlags = 0;
    if (aJson.contains(JSON_ADDR))
    {
        aJson.at(JSON_ADDR).get_to(aValue.mAgent.mAddr);
        aValue.mAgent.mPresentFlags |= BorderAgent::kAddrBit;
    }
    if (aJson.contains(JSON_PORT))
    {
        aJson.at(JSON_PORT).get_to(aValue.mAgent.mPort);
        aValue.mAgent.mPresentFlags |= BorderAgent::kPortBit;
    }
    if (aJson.contains(JSON_THREAD_VERSION))
    {
        aJson.at(JSON_THREAD_VERSION).get_to(aValue.mAgent.mThreadVersion);
        aValue.mAgent.mPresentFlags |= BorderAgent::kThreadVersionBit;
    }
    if (aJson.contains(JSON_STATE_BITMAP))
    {
        uint32_t value;
        aJson.at(JSON_STATE_BITMAP).get_to(value);
        aValue.mAgent.mState = BorderAgent::State(value);
        aValue.mAgent.mPresentFlags |= BorderAgent::kStateBit;
    }
    if (aJson.contains(JSON_NWK_REF))
    {
        aJson.at(JSON_NWK_REF).get_to(aValue.mNetworkId);
    }
    if (aJson.contains(JSON_VENDOR_NAME))
    {
        aJson.at(JSON_VENDOR_NAME).get_to(aValue.mAgent.mVendorName);
        aValue.mAgent.mPresentFlags |= BorderAgent::kVendorNameBit;
    }
    if (aJson.contains(JSON_MODEL_NAME))
    {
        aJson.at(JSON_MODEL_NAME).get_to(aValue.mAgent.mModelName);
        aValue.mAgent.mPresentFlags |= BorderAgent::kModelNameBit;
    }
    if (aJson.contains(JSON_ACTIVE_TIMESTAMP))
    {
        uint64_t value;
        aJson.at(JSON_ACTIVE_TIMESTAMP).get_to(value);
        aValue.mAgent.mActiveTimestamp = Timestamp::Decode(value);
        aValue.mAgent.mPresentFlags |= BorderAgent::kActiveTimestampBit;
    }
    if (aJson.contains(JSON_PARTITION_ID))
    {
        aJson.at(JSON_PARTITION_ID).get_to(aValue.mAgent.mPartitionId);
        aValue.mAgent.mPresentFlags |= BorderAgent::kPartitionIdBit;
    }
    if (aJson.contains(JSON_VENDOR_DATA))
    {
        aJson.at(JSON_VENDOR_DATA).get_to(aValue.mAgent.mVendorData);
        aValue.mAgent.mPresentFlags |= BorderAgent::kVendorDataBit;
    }
    if (aJson.contains(JSON_VENDOR_OUI))
    {
        Error       error;
        std::string value;
        aJson.at(JSON_VENDOR_OUI).get_to(value);
        error = ot::commissioner::utils::Hex(aValue.mAgent.mVendorOui, value);
        ASSERT(error.GetCode() == ErrorCode::kNone);
        aValue.mAgent.mPresentFlags |= BorderAgent::kVendorOuiBit;
    }
    if (aJson.contains(JSON_BBR_SEQ_NUMBER))
    {
        aJson.at(JSON_BBR_SEQ_NUMBER).get_to(aValue.mAgent.mBbrSeqNumber);
        aValue.mAgent.mPresentFlags |= BorderAgent::kBbrSeqNumberBit;
    }
    if (aJson.contains(JSON_BBR_PORT))
    {
        aJson.at(JSON_BBR_PORT).get_to(aValue.mAgent.mBbrPort);
        aValue.mAgent.mPresentFlags |= BorderAgent::kBbrPortBit;
    }
    if (aJson.contains(JSON_SERVICE_NAME))
    {
        aJson.at(JSON_SERVICE_NAME).get_to(aValue.mAgent.mServiceName);
        aValue.mAgent.mPresentFlags |= BorderAgent::kServiceNameBit;
    }
    if (aJson.contains(JSON_UPDATE_TIMESTAMP))
    {
        std::string timeStr;
        aJson.at(JSON_UPDATE_TIMESTAMP).get_to(timeStr);
        UnixTime timeStamp;
        if (UnixTime::FromString(timeStamp, timeStr).GetCode() == ErrorCode::kNone && timeStamp.mTime != 0)
        {
            aValue.mAgent.mUpdateTimestamp.mTime = timeStamp.mTime;
            aValue.mAgent.mPresentFlags |= BorderAgent::kUpdateTimestampBit;
        }
    }
}